

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t1load.c
# Opt level: O2

FT_Error t1_allocate_blend(T1_Face face,FT_UInt num_designs,FT_UInt num_axis)

{
  FT_Memory memory;
  FT_String *pFVar1;
  PS_Blend pPVar2;
  PS_FontInfo pPVar3;
  PS_Private pPVar4;
  FT_BBox *pFVar5;
  long lVar6;
  FT_Error error;
  ulong local_38;
  
  memory = (face->root).memory;
  error = 0;
  pPVar2 = face->blend;
  if (pPVar2 == (PS_Blend)0x0) {
    pPVar2 = (PS_Blend)ft_mem_alloc(memory,0x300,&error);
    if (error != 0) {
      return error;
    }
    pPVar2->num_default_design_vector = 0;
    pPVar2->design_pos[0] = (FT_Fixed *)0x0;
    pPVar2->weight_vector = (FT_Fixed *)0x0;
    pPVar2->default_weight_vector = (FT_Fixed *)0x0;
    face->blend = pPVar2;
  }
  if (num_designs != 0) {
    if (pPVar2->num_designs == 0) {
      local_38 = (ulong)num_designs;
      pPVar3 = (PS_FontInfo)ft_mem_realloc(memory,0x38,0,(ulong)num_designs,(void *)0x0,&error);
      pPVar2->font_infos[1] = pPVar3;
      if (error != 0) {
        return error;
      }
      pPVar4 = (PS_Private)ft_mem_realloc(memory,0xe0,0,local_38,(void *)0x0,&error);
      pPVar2->privates[1] = pPVar4;
      if (error != 0) {
        return error;
      }
      pFVar5 = (FT_BBox *)ft_mem_realloc(memory,0x20,0,local_38,(void *)0x0,&error);
      pPVar2->bboxes[1] = pFVar5;
      if (error != 0) {
        return error;
      }
      pPVar2->font_infos[0] = &(face->type1).font_info;
      pPVar2->privates[0] = &(face->type1).private_dict;
      pPVar2->bboxes[0] = &(face->type1).font_bbox;
      for (lVar6 = 0x48; lVar6 - 0x46U <= local_38; lVar6 = lVar6 + 1) {
        pFVar1 = pPVar2->axis_names[lVar6 + -2];
        *(long *)((long)pPVar2 + lVar6 * 8 + -0x118) =
             *(long *)((long)pPVar2 + lVar6 * 8 + -0x120) + 0x38;
        *(long *)((long)pPVar2 + lVar6 * 8 + -0x90) =
             *(long *)((long)pPVar2 + lVar6 * 8 + -0x98) + 0xe0;
        pPVar2->axis_names[lVar6 + -1] = pFVar1 + 0x20;
      }
      pPVar2->num_designs = num_designs;
    }
    else if (pPVar2->num_designs != num_designs) {
      return 3;
    }
  }
  if (num_axis == 0) {
    return error;
  }
  if (pPVar2->num_axis != 0 && pPVar2->num_axis != num_axis) {
    return 3;
  }
  pPVar2->num_axis = num_axis;
  return error;
}

Assistant:

static FT_Error
  t1_allocate_blend( T1_Face  face,
                     FT_UInt  num_designs,
                     FT_UInt  num_axis )
  {
    PS_Blend   blend;
    FT_Memory  memory = face->root.memory;
    FT_Error   error  = FT_Err_Ok;


    blend = face->blend;
    if ( !blend )
    {
      if ( FT_NEW( blend ) )
        goto Exit;

      blend->num_default_design_vector = 0;
      blend->weight_vector             = NULL;
      blend->default_weight_vector     = NULL;
      blend->design_pos[0]             = NULL;

      face->blend = blend;
    }

    /* allocate design data if needed */
    if ( num_designs > 0 )
    {
      if ( blend->num_designs == 0 )
      {
        FT_UInt  nn;


        /* allocate the blend `private' and `font_info' dictionaries */
        if ( FT_NEW_ARRAY( blend->font_infos[1], num_designs ) ||
             FT_NEW_ARRAY( blend->privates  [1], num_designs ) ||
             FT_NEW_ARRAY( blend->bboxes    [1], num_designs ) )
          goto Exit;

        blend->font_infos[0] = &face->type1.font_info;
        blend->privates  [0] = &face->type1.private_dict;
        blend->bboxes    [0] = &face->type1.font_bbox;

        for ( nn = 2; nn <= num_designs; nn++ )
        {
          blend->font_infos[nn] = blend->font_infos[nn - 1] + 1;
          blend->privates  [nn] = blend->privates  [nn - 1] + 1;
          blend->bboxes    [nn] = blend->bboxes    [nn - 1] + 1;
        }

        blend->num_designs = num_designs;
      }
      else if ( blend->num_designs != num_designs )
        goto Fail;
    }

    /* allocate axis data if needed */
    if ( num_axis > 0 )
    {
      if ( blend->num_axis != 0 && blend->num_axis != num_axis )
        goto Fail;

      blend->num_axis = num_axis;
    }

  Exit:
    return error;

  Fail:
    error = FT_THROW( Invalid_File_Format );
    goto Exit;
  }